

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void collect_scan_var(gen_ctx_t gen_ctx,MIR_reg_t var)

{
  int iVar1;
  lr_ctx *plVar2;
  size_t sVar3;
  ulong nb;
  
  nb = (ulong)var;
  iVar1 = bitmap_set_bit_p(gen_ctx->temp_bitmap,nb);
  if ((iVar1 != 0) && (plVar2 = gen_ctx->lr_ctx, plVar2->scan_vars_num < 10000)) {
    while( true ) {
      sVar3 = VARR_intlength(plVar2->var_to_scan_var_map);
      if (nb < sVar3) break;
      VARR_intpush(gen_ctx->lr_ctx->var_to_scan_var_map,-1);
      plVar2 = gen_ctx->lr_ctx;
    }
    VARR_MIR_reg_tpush(gen_ctx->lr_ctx->scan_var_to_var_map,var);
    plVar2 = gen_ctx->lr_ctx;
    iVar1 = plVar2->scan_vars_num;
    plVar2->scan_vars_num = iVar1 + 1;
    VARR_intset(plVar2->var_to_scan_var_map,nb,iVar1);
    return;
  }
  return;
}

Assistant:

static void collect_scan_var (gen_ctx_t gen_ctx, MIR_reg_t var) {
  if (!bitmap_set_bit_p (temp_bitmap, var)) return;
  if (scan_vars_num >= MIR_MAX_COALESCE_VARS) return;
  while (VARR_LENGTH (int, var_to_scan_var_map) <= var) VARR_PUSH (int, var_to_scan_var_map, -1);
  VARR_PUSH (MIR_reg_t, scan_var_to_var_map, var);
  VARR_SET (int, var_to_scan_var_map, var, scan_vars_num++);
}